

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O3

size_t __thiscall
vectorstr_hash::operator()
          (vectorstr_hash *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *p)

{
  pointer pbVar1;
  size_t sVar2;
  size_type sVar3;
  long lVar4;
  long lVar5;
  
  pbVar1 = (p->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(p->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar4 == 0) {
    sVar2 = 1;
  }
  else {
    lVar4 = lVar4 >> 5;
    sVar2 = 1;
    lVar5 = 0;
    do {
      if (pbVar1[lVar5]._M_string_length != 0) {
        sVar3 = 0;
        do {
          sVar2 = (long)((long)pbVar1[lVar5]._M_dataplus._M_p[sVar3] * sVar2) % 0x5f5e0fd;
          sVar3 = sVar3 + 1;
        } while (pbVar1[lVar5]._M_string_length != sVar3);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar4 + (ulong)(lVar4 == 0));
  }
  return sVar2;
}

Assistant:

std::size_t operator () (const std::vector<string> &p) const
	{
		long long hash_value = 1;
		for (auto i = 0; i < p.size(); i ++)
			for (auto j = 0; j < p[i].size(); j ++)
				hash_value = (long long) hash_value * (long long) p[i][j] % 99999997LL;

		return (size_t) hash_value;
	}